

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

void __thiscall QDomNodePrivate::normalize(QDomNodePrivate *this)

{
  long lVar1;
  QArrayData *pQVar2;
  int iVar3;
  QDomNodePrivate *pQVar4;
  QDomNodePrivate *pQVar5;
  QDomNodePrivate *tmp;
  QDomNodePrivate *pQVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->first != (QDomNodePrivate *)0x0) {
    pQVar4 = (QDomNodePrivate *)0x0;
    pQVar5 = this->first;
    do {
      iVar3 = (*pQVar5->_vptr_QDomNodePrivate[0xb])(pQVar5);
      if (iVar3 - 3U < 2) {
        pQVar6 = pQVar5->next;
        if (pQVar4 != (QDomNodePrivate *)0x0) {
          pQVar2 = &((pQVar5->value).d.d)->super_QArrayData;
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append(&pQVar4->value);
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar2,2,0x10);
            }
          }
          (*this->_vptr_QDomNodePrivate[6])(this,pQVar5);
          pQVar5 = pQVar4;
        }
      }
      else {
        pQVar6 = pQVar5->next;
        pQVar5 = (QDomNodePrivate *)0x0;
      }
      pQVar4 = pQVar5;
      pQVar5 = pQVar6;
    } while (pQVar6 != (QDomNodePrivate *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomNodePrivate::normalize()
{
    // ### This one has moved from QDomElementPrivate to this position. It is
    // not tested.
    qNormalizeNode(this);
}